

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  undefined4 in_register_00000034;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_00;
  
  this_00 = (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)
            CONCAT44(in_register_00000034,__fd);
  std::istream::seekg(&this_00->stream_,(long)__buf * 0x38 + (this_00->data_begin_)._M_off,
                      (this_00->data_begin_)._M_state);
  check_stream(this_00,"seekg for read");
  read<hta::TimeAggregate>((TimeAggregate *)this,this_00);
  return (ssize_t)this;
}

Assistant:

value_type read(pos_type pos)
    {
        stream_.seekg(data_begin_ + static_cast<pos_type>(pos * value_size));
        check_stream("seekg for read");
        return read<value_type>();
    }